

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O0

int csp_id_strip(csp_packet_t *packet)

{
  long in_RDI;
  csp_packet_t *in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  *(undefined4 *)(in_RDI + 4) = 0;
  if (csp_conf.version == '\x02') {
    local_4 = csp_id2_strip(in_stack_ffffffffffffffe8);
  }
  else {
    local_4 = csp_id1_strip(in_stack_ffffffffffffffe8);
  }
  return local_4;
}

Assistant:

int csp_id_strip(csp_packet_t * packet) {
	packet->timestamp_rx = 0;
	if (csp_conf.version == 2) {
		return csp_id2_strip(packet);
	} else {
		return csp_id1_strip(packet);
	}
}